

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O2

void handleFramePoseOptions(KinDynComputations *comp,parser *cmd)

{
  bool bVar1;
  char cVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  string *psVar6;
  string referenceFrameName;
  string frameName;
  Transform referenceFrame_H_name;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 local_150 [16];
  string local_140 [32];
  string local_120 [4];
  string local_a0;
  allocator<char> local_80 [96];
  
  psVar3 = (string *)iDynTree::KinDynComputations::getRobotModel();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_120,"frame-pose",local_80);
  bVar1 = cmdline::parser::exist(cmd,local_120);
  std::__cxx11::string::~string((string *)local_120);
  if (!bVar1) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_120,"frame-pose",local_80);
  pbVar4 = cmdline::parser::get<std::__cxx11::string>(cmd,local_120);
  std::__cxx11::string::string(local_140,(string *)pbVar4);
  std::__cxx11::string::~string((string *)local_120);
  local_160 = local_150;
  local_158 = 0;
  local_150[0] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_120,"frame-pose-reference-frame",local_80);
  bVar1 = cmdline::parser::exist(cmd,local_120);
  std::__cxx11::string::~string((string *)local_120);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"frame-pose-reference-frame",local_80);
    cmdline::parser::get<std::__cxx11::string>(cmd,local_120);
    std::__cxx11::string::_M_assign((string *)&local_160);
  }
  else {
    iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::getDefaultBaseLink();
    iDynTree::Model::getFrameName_abi_cxx11_((long)local_120);
    std::__cxx11::string::operator=((string *)&local_160,(string *)local_120);
  }
  std::__cxx11::string::~string((string *)local_120);
  psVar6 = local_140;
  iDynTree::Model::getFrameIndex(psVar3);
  cVar2 = iDynTree::Model::isValidFrameIndex((long)psVar3);
  if (cVar2 == '\0') {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Frame ");
  }
  else {
    psVar6 = (string *)&local_160;
    iDynTree::Model::getFrameIndex(psVar3);
    cVar2 = iDynTree::Model::isValidFrameIndex((long)psVar3);
    if (cVar2 != '\0') {
      iDynTree::KinDynComputations::getRelativeTransform((string *)local_80,(string *)comp);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_160);
      poVar5 = std::operator<<(poVar5,"_H_");
      poVar5 = std::operator<<(poVar5,local_140);
      poVar5 = std::operator<<(poVar5," is \n");
      iDynTree::Transform::asHomogeneousTransform();
      iDynTree::MatrixFixSize<4u,4u>::toString_abi_cxx11_(&local_a0,local_120);
      poVar5 = std::operator<<(poVar5,(string *)&local_a0);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_a0);
      goto LAB_00104de8;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"Frame ");
  }
  poVar5 = std::operator<<(poVar5,psVar6);
  poVar5 = std::operator<<(poVar5," not found in the model");
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_00104de8:
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string(local_140);
  return;
}

Assistant:

void handleFramePoseOptions(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    using namespace iDynTree;

    const Model & model = comp.getRobotModel();

    if( !cmd.exist("frame-pose") )
    {
        return;
    }

    std::string frameName = cmd.get<std::string>("frame-pose");

    std::string referenceFrameName;
    if( cmd.exist("frame-pose-reference-frame") )
    {
        referenceFrameName = cmd.get<std::string>("frame-pose-reference-frame");
    }
    else
    {
        referenceFrameName = model.getFrameName(comp.getRobotModel().getDefaultBaseLink());
    }

    if( !model.isValidFrameIndex(model.getFrameIndex(frameName)) )
    {
        std::cerr << "Frame " << frameName << " not found in the model" << std::endl;
	return;
    }

    if( !model.isValidFrameIndex(model.getFrameIndex(referenceFrameName)) )
    {
        std::cerr << "Frame " << referenceFrameName << " not found in the model" << std::endl;
	return;
    }

    Transform referenceFrame_H_name = comp.getRelativeTransform(referenceFrameName,frameName);


    std::cout << referenceFrameName << "_H_" << frameName << " is \n" << referenceFrame_H_name.asHomogeneousTransform().toString() << std::endl;
}